

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  bool *pbVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  idx_t iVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  long lVar16;
  bool bVar17;
  undefined8 local_88;
  void *local_80;
  undefined8 local_78;
  void *local_70;
  ulong local_68;
  bool *local_60;
  ulong local_58;
  unsigned_long *local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  
  puVar6 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = result_data;
  local_48 = count;
  if (puVar6 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar16 = 8;
      iVar7 = 0;
      do {
        local_78 = *(undefined8 *)((long)ldata + lVar16 + -8);
        local_70 = *(void **)((long)&ldata->value + lVar16);
        local_88 = *(ulong *)((long)rdata + lVar16 + -8);
        local_80 = *(void **)((long)&rdata->value + lVar16);
        pvVar9 = local_70;
        if ((uint)local_78 < 0xd) {
          pvVar9 = (void *)((long)&local_78 + 4);
        }
        uVar2 = (uint)local_88;
        pvVar8 = local_80;
        if (uVar2 < 0xd) {
          pvVar8 = (void *)((long)&local_88 + 4);
        }
        if (uVar2 == 0) {
          bVar17 = true;
        }
        else if ((uint)local_78 < uVar2) {
          bVar17 = false;
        }
        else {
          iVar3 = bcmp(pvVar9,pvVar8,local_88 & 0xffffffff);
          bVar17 = iVar3 == 0;
        }
        local_60[iVar7] = bVar17;
        iVar7 = iVar7 + 1;
        lVar16 = lVar16 + 0x10;
      } while (local_48 != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = count + 0x3f >> 6;
    local_68 = 0;
    uVar12 = 0;
    local_58 = uVar4;
    local_50 = puVar6;
    do {
      pbVar1 = local_60;
      uVar15 = puVar6[local_68];
      uVar10 = uVar12 + 0x40;
      if (local_48 <= uVar12 + 0x40) {
        uVar10 = local_48;
      }
      uVar11 = uVar10;
      if (uVar15 != 0) {
        uVar11 = uVar12;
        local_40 = uVar10;
        if (uVar15 == 0xffffffffffffffff) {
          if (uVar12 < uVar10) {
            uVar14 = uVar12 << 4 | 8;
            do {
              local_78 = *(undefined8 *)((long)ldata + (uVar14 - 8));
              local_70 = *(void **)((long)&ldata->value + uVar14);
              local_88 = *(ulong *)((long)rdata + (uVar14 - 8));
              local_80 = *(void **)((long)&rdata->value + uVar14);
              pvVar9 = local_70;
              if ((uint)local_78 < 0xd) {
                pvVar9 = (void *)((long)&local_78 + 4);
              }
              uVar2 = (uint)local_88;
              pvVar8 = local_80;
              if (uVar2 < 0xd) {
                pvVar8 = (void *)((long)&local_88 + 4);
              }
              if (uVar2 == 0) {
                bVar17 = true;
              }
              else if ((uint)local_78 < uVar2) {
                bVar17 = false;
              }
              else {
                iVar3 = bcmp(pvVar9,pvVar8,local_88 & 0xffffffff);
                bVar17 = iVar3 == 0;
                uVar10 = local_40;
              }
              pbVar1[uVar12] = bVar17;
              uVar12 = uVar12 + 1;
              uVar14 = uVar14 + 0x10;
              uVar4 = local_58;
              uVar11 = uVar10;
            } while (uVar10 != uVar12);
          }
        }
        else {
          uVar14 = uVar10 - uVar12;
          puVar6 = local_50;
          if (uVar12 < uVar10) {
            uVar13 = uVar12 << 4 | 8;
            uVar5 = 0;
            local_38 = uVar15;
            do {
              if ((uVar15 >> (uVar5 & 0x3f) & 1) != 0) {
                local_78 = *(undefined8 *)((long)ldata + (uVar13 - 8));
                local_70 = *(void **)((long)&ldata->value + uVar13);
                local_88 = *(ulong *)((long)rdata + (uVar13 - 8));
                local_80 = *(void **)((long)&rdata->value + uVar13);
                pvVar9 = local_70;
                if ((uint)local_78 < 0xd) {
                  pvVar9 = (void *)((long)&local_78 + 4);
                }
                uVar2 = (uint)local_88;
                pvVar8 = local_80;
                if (uVar2 < 0xd) {
                  pvVar8 = (void *)((long)&local_88 + 4);
                }
                if (uVar2 == 0) {
                  bVar17 = true;
                }
                else if ((uint)local_78 < uVar2) {
                  bVar17 = false;
                }
                else {
                  iVar3 = bcmp(pvVar9,pvVar8,local_88 & 0xffffffff);
                  bVar17 = iVar3 == 0;
                  uVar10 = local_40;
                  uVar15 = local_38;
                }
                pbVar1[uVar5 + uVar12] = bVar17;
              }
              uVar5 = uVar5 + 1;
              uVar13 = uVar13 + 0x10;
              uVar4 = local_58;
              puVar6 = local_50;
              uVar11 = uVar10;
            } while (uVar14 != uVar5);
          }
        }
      }
      local_68 = local_68 + 1;
      uVar12 = uVar11;
    } while (local_68 != uVar4);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}